

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Else(w3Interp *this)

{
  reference pvVar1;
  w3Interp *this_local;
  
  BlockEnd(this);
  pvVar1 = std::vector<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>::operator[]
                     (&this->frame->code->decoded_instructions,
                      (((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.
                      field_8.if_end);
  (this->super_Wasm).instr = pvVar1 + -1;
  return;
}

Assistant:

INTERP (Else)
{
     __debugbreak ();

    // Else marks the end of If is like BlockEnd, but also
    // skips the Else block.
    //.
    // If we are actually running the else case,
    // the If will have branched past the else instruction.

    BlockEnd ();
    // Branch to one before target, because interpreter loop will increment.
    instr = &frame->code->decoded_instructions [instr->if_end] - 1;
}